

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

char * qcc_arena_vsprintf(qcc_arena *arena,char *fmt,__va_list_tag *args)

{
  uint uVar1;
  uint8_t *__s;
  va_list tmp;
  undefined8 local_28;
  void *pvStack_20;
  void *local_18;
  
  __s = arena->free_memory;
  local_18 = args->reg_save_area;
  local_28._0_4_ = args->gp_offset;
  local_28._4_4_ = args->fp_offset;
  pvStack_20 = args->overflow_arg_area;
  uVar1 = vsnprintf((char *)__s,(long)arena->objects - (long)arena->free_memory,fmt,&local_28);
  if ((ulong)uVar1 < (ulong)((long)arena->objects - (long)arena->free_memory)) {
    arena->free_memory = arena->free_memory + (uVar1 + 1);
  }
  else {
    __s = (uint8_t *)0x0;
  }
  return (char *)__s;
}

Assistant:

const char *qcc_arena_vsprintf(struct qcc_arena *arena, const char *fmt,
                               va_list args)
{
    char *str = (char *)arena->free_memory;

    va_list tmp;
    va_copy(tmp, args);
    unsigned len = vsnprintf(str, qcc_arena_memory_available(arena), fmt, tmp);
    va_end(tmp);

    if (len < qcc_arena_memory_available(arena))
    {
        arena->free_memory += len + 1;
        return str;
    }

    return 0;
}